

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitPropLoad
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool skipUseBeforeDeclarationCheck)

{
  ByteCodeWriter *this_00;
  Scope *symScope;
  code *pcVar1;
  ByteCodeGenerator *pBVar2;
  FuncInfo *pFVar3;
  bool bVar4;
  ushort uVar5;
  ProfileId PVar6;
  OpCode OVar7;
  PropertyId PVar8;
  uint uVar9;
  RegSlot RVar10;
  ByteCodeLabel labelID;
  Scope **ppSVar11;
  undefined4 *puVar12;
  Scope *scope;
  ParseNodeVar *pPVar13;
  Type *pTVar14;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar15;
  uint32 slotId;
  FuncInfo *this_01;
  undefined7 in_register_00000089;
  int i;
  int index;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 scopeLocation;
  undefined1 local_b8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  DynamicLoadRecord local_70;
  undefined4 local_64;
  undefined4 *local_60;
  Scope **local_58;
  PropertyId local_4c;
  ByteCodeGenerator *pBStack_48;
  PropertyId envIndex;
  FuncInfo *local_40;
  RegSlot local_34;
  
  local_4c = -1;
  local_58 = &this->globalScope;
  ppSVar11 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar11 = local_58;
  }
  symScope = *ppSVar11;
  pBStack_48 = this;
  local_34 = lhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x13b4,"(symScope)","symScope");
    if (!bVar4) goto LAB_0075fdf0;
    *puVar12 = 0;
  }
  pBVar2 = pBStack_48;
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    EmitModuleExportAccess(pBStack_48,sym,LdModuleSlot,local_34,funcInfo);
    return;
  }
  local_64 = (undefined4)CONCAT71(in_register_00000089,skipUseBeforeDeclarationCheck);
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       pBStack_48->alloc;
  local_b8 = (undefined1  [8])&PTR_IsReadOnly_0137a130;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  recList._40_8_ = &sym->scope;
  local_40 = funcInfo;
  local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_00 = &pBVar2->m_writer;
  scopeLocation.index = 0xffffffff;
  scope = (Scope *)0x0;
  while ((scope = FindScopeForSym(pBStack_48,symScope,scope,&local_4c,local_40), scope != *local_58
         && (scopeLocation = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2)scope->location,
            scope != symScope))) {
    uVar5 = *(ushort *)&scope->field_0x44;
    if ((uVar5 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x13ce,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar4) goto LAB_0075fdf0;
      *local_60 = 0;
      uVar5 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar5 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x13cf,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar4) goto LAB_0075fdf0;
      *local_60 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord(&local_70);
    local_70.label = Js::ByteCodeWriter::DefineLabel(this_00);
    if (sym == (Symbol *)0x0) {
      PVar8 = pid->m_propertyId;
    }
    else {
      PVar8 = Symbol::EnsurePosition(sym,pBStack_48);
    }
    uVar9 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar8);
    if (scope->scopeType == ScopeType_With) {
      if (local_4c == -1) {
        Js::ByteCodeWriter::BrProperty
                  (this_00,BrOnHasProperty,local_70.label,scopeLocation.instance,uVar9);
        local_70.kind = LocalWith;
        local_70.field_2 = scopeLocation;
      }
      else {
        aVar15.index = local_4c + 1;
        Js::ByteCodeWriter::BrEnvProperty
                  (this_00,BrOnHasEnvProperty,local_70.label,uVar9,aVar15.index);
        local_70.kind = EnvWith;
        local_70.field_2.index = aVar15.index;
      }
    }
    else if (local_4c == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,local_70.label,uVar9);
      local_70.kind = Local;
      local_70.field_2 = scopeLocation;
    }
    else {
      aVar15.index = local_4c + 1;
      Js::ByteCodeWriter::BrEnvProperty
                (this_00,BrOnHasLocalEnvProperty,local_70.label,uVar9,aVar15.index);
      local_70.kind = Env;
      local_70.field_2.index = aVar15.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_b8,&local_70);
  }
  if (sym == (Symbol *)0x0) {
    PVar8 = pid->m_propertyId;
LAB_0075f8be:
    pFVar3 = local_40;
    if ((pBStack_48->flags >> 10 & 1) == 0) {
      if ((pBStack_48->flags & 4) == 0) {
        if (PVar8 == 0x27a) {
          OVar7 = LdChakraLib;
          if ((DAT_01436215 == '\0') && (DAT_01436216 == '\0')) {
LAB_0075fad8:
            EmitPatchableRootProperty(pBStack_48,LdRootFld,local_34,PVar8,false,false,local_40);
            goto LAB_0075faf3;
          }
        }
        else if (PVar8 == 0x105) {
          OVar7 = LdNaN;
        }
        else if (PVar8 == 0x186) {
          OVar7 = LdUndef;
        }
        else {
          if (PVar8 != 0xba) goto LAB_0075fad8;
          OVar7 = LdInfinity;
        }
        Js::ByteCodeWriter::Reg1(this_00,OVar7,local_34);
      }
      else {
        RVar10 = FuncInfo::GetEnvRegister(local_40);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,false);
        Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,local_34,uVar9,false,true);
      }
    }
    else if ((((local_40->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
            (bVar4 = FuncInfo::IsGlobalFunction(local_40), !bVar4)) {
      RVar10 = FuncInfo::GetEnvRegister(pFVar3);
      uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,false);
      Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,local_34,uVar9,false,true);
    }
    else {
      uVar9 = FuncInfo::FindOrAddInlineCacheId
                        (pFVar3,pFVar3->frameDisplayRegister,PVar8,false,false);
      Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,local_34,uVar9,false,true);
    }
  }
  else if (((*(ushort *)&sym->field_0x42 & 1) == 0) ||
          (scope->func != local_40 || (char)local_64 != '\0')) {
    if ((*(ushort *)&sym->field_0x42 & 8) != 0) {
      PVar8 = Symbol::EnsurePosition(sym,pBStack_48);
      goto LAB_0075f8be;
    }
    bVar4 = Symbol::IsInSlot(sym,pBStack_48,local_40,false);
    pFVar3 = local_40;
    if (bVar4 || local_4c != -1) {
      PVar8 = Symbol::EnsureScopeSlot(sym,pBStack_48,local_40);
      this_01 = pFVar3;
      PVar6 = FuncInfo::FindOrAddSlotProfileId(pFVar3,scope,PVar8);
      local_58 = (Scope **)CONCAT62(local_58._2_6_,PVar6);
      bVar4 = NeedCheckBlockVar((ByteCodeGenerator *)this_01,sym,scope,pFVar3);
      local_64 = CONCAT31(local_64._1_3_,bVar4);
      OVar7 = GetLdSlotOp((ByteCodeGenerator *)this_01,scope,local_4c,scopeLocation.instance,pFVar3)
      ;
      slotId = PVar8 + (~*(uint *)(*(long *)recList._40_8_ + 0x44) & 2);
      PVar6 = (ProfileId)local_58;
      if (local_4c == -1) {
        if ((scopeLocation.index == 0xffffffff) ||
           ((scopeLocation.index != local_40->frameSlotsRegister &&
            (scopeLocation.index != local_40->frameObjRegister)))) {
          uVar9 = scope->innerScopeIndex;
          if (uVar9 != 0xffffffff) goto LAB_0075f84c;
          if ((scope->field_0x44 & 2) == 0) {
            local_58 = (Scope **)CONCAT44(local_58._4_4_,(uint)OVar7);
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_60 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x146d,"(scope->GetIsObject())","scope->GetIsObject()");
            if (!bVar4) {
LAB_0075fdf0:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *local_60 = 0;
            OVar7 = (OpCode)local_58;
          }
          Js::ByteCodeWriter::Slot(this_00,OVar7,local_34,scopeLocation.instance,slotId,PVar6);
        }
        else {
          Js::ByteCodeWriter::SlotI1(this_00,OVar7,local_34,slotId,(ProfileId)local_58);
        }
      }
      else {
        uVar9 = local_4c + 1;
LAB_0075f84c:
        Js::ByteCodeWriter::SlotI2(this_00,OVar7,local_34,uVar9,slotId,(ProfileId)local_58);
      }
      if ((char)local_64 != '\0') {
        Js::ByteCodeWriter::Reg1(this_00,ChkUndecl,local_34);
      }
    }
    else {
      if (sym->location != local_34) {
        Js::ByteCodeWriter::Reg2(this_00,Ld_A,local_34,sym->location);
      }
      if ((((sym->field_0x42 & 2) != 0) && ((sym->decl->nop & ~knopName) == knopConstDecl)) &&
         (pPVar13 = ParseNode::AsParseNodeVar(sym->decl), pPVar13->isSwitchStmtDecl != '\0')) {
        Js::ByteCodeWriter::Reg1(this_00,ChkUndecl,local_34);
      }
    }
  }
  else {
    bVar4 = Symbol::IsInSlot(sym,pBStack_48,local_40,false);
    if (bVar4) {
      PVar8 = Symbol::EnsureScopeSlot(sym,pBStack_48,local_40);
      FuncInfo::FindOrAddSlotProfileId(local_40,scope,PVar8);
    }
    EmitUseBeforeDeclarationRuntimeError(pBStack_48,local_34);
  }
LAB_0075faf3:
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer != 0) {
    labelID = Js::ByteCodeWriter::DefineLabel(this_00);
    Js::ByteCodeWriter::Br(this_00,labelID);
    local_58 = (Scope **)CONCAT44(local_58._4_4_,labelID);
    index = 0;
    do {
      if (sym == (Symbol *)0x0) {
        PVar8 = pid->m_propertyId;
      }
      else {
        PVar8 = Symbol::EnsurePosition(sym,pBStack_48);
      }
      pTVar14 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b8,index);
      Js::ByteCodeWriter::MarkLabel(this_00,pTVar14->label);
      pTVar14 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b8,index);
      switch(pTVar14->kind) {
      case Local:
        pTVar14 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b8,index);
        uVar9 = FuncInfo::FindOrAddInlineCacheId
                          (local_40,(pTVar14->field_2).instance,PVar8,false,false);
        Js::ByteCodeWriter::ElementP(this_00,LdLocalFld_ReuseLoc,local_34,uVar9,false,true);
        goto LAB_0075fd2b;
      case Env:
        RVar10 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar14 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b8,index);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar10,(pTVar14->field_2).index);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,local_34,RVar10,uVar9,false,true);
        break;
      case LocalWith:
        RVar10 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar14 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b8,index);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar10,(pTVar14->field_2).instance);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,local_34,RVar10,uVar9,false,true);
        break;
      case EnvWith:
        RVar10 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar14 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b8,index);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar10,(pTVar14->field_2).index);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar10,RVar10);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,local_34,RVar10,uVar9,false,true);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_60 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14af,"((0))","(0)");
        if (bVar4) {
          *local_60 = 0;
          goto LAB_0075fd2b;
        }
        goto LAB_0075fdf0;
      }
      FuncInfo::ReleaseTmpRegister(local_40,RVar10);
LAB_0075fd2b:
      if (index == (int)recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        .buffer + -1) goto LAB_0075fd4f;
      Js::ByteCodeWriter::Br(this_00,(ByteCodeLabel)local_58);
      index = index + 1;
    } while( true );
  }
LAB_0075fd5a:
  JsUtil::
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_b8);
  return;
LAB_0075fd4f:
  Js::ByteCodeWriter::MarkLabel(this_00,(ByteCodeLabel)local_58);
  goto LAB_0075fd5a;
}

Assistant:

void ByteCodeGenerator::EmitPropLoad(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool skipUseBeforeDeclarationCheck)
{
    // If sym belongs to a parent frame, get it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just copy the value to the lhsLocation.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, lhsLocation, funcInfo);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        scopeLocation = scope->GetLocation();

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo && !skipUseBeforeDeclarationCheck)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        if (skipUseBeforeDeclarationCheck)
        {
            if (lhsLocation != Js::Constants::NoRegister)
            {
                this->m_writer.Reg1(Js::OpCode::InitUndecl, lhsLocation);
            }
        }
        else
        {
            EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
        }
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, false);
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

                // Load of a symbol with unknown scope from within eval
                // Get it from the closure environment.
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

            // Load of a symbol with unknown scope from within event handler.
            // Get it from the closure environment.
            this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
        }
        else
        {
            // Special case non-writable built-ins
            // TODO: support non-writable global property in general by detecting what attribute the property have current?
            // But can't be done if we are byte code serialized, because the attribute might be different for use fields
            // next time we run. May want to catch that in the JIT.
            Js::OpCode opcode = Js::OpCode::LdRootFld;

            // These properties are non-writable
            switch (propertyId)
            {
            case Js::PropertyIds::NaN:
                opcode = Js::OpCode::LdNaN;
                break;
            case Js::PropertyIds::Infinity:
                opcode = Js::OpCode::LdInfinity;
                break;
            case Js::PropertyIds::undefined:
                opcode = Js::OpCode::LdUndef;
                break;
            case Js::PropertyIds::__chakraLibrary:
                if (CONFIG_FLAG(LdChakraLib) || CONFIG_FLAG(TestChakraLib))
                {
                    opcode = Js::OpCode::LdChakraLib;
                }
                break;
            }

            if (opcode == Js::OpCode::LdRootFld)
            {
                this->EmitPatchableRootProperty(Js::OpCode::LdRootFld, lhsLocation, propertyId, false, false, funcInfo);
            }
            else
            {
                this->Writer()->Reg1(opcode, lhsLocation);
            }
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        // Now get the property from its slot.
        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, lhsLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, lhsLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, lhsLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, lhsLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }
    else
    {
        if (lhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, lhsLocation, sym->GetLocation());
        }
        if (sym->GetIsBlockVar() && ((sym->GetDecl()->nop == knopLetDecl || sym->GetDecl()->nop == knopConstDecl) && sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl))
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, false);
                    this->m_writer.ElementP(Js::OpCode::LdLocalFld_ReuseLoc, lhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

}